

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::shift<(moira::Core)0,(moira::Instr)10,2>(Moira *this,int cnt,u64 data)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  
  uVar1 = 0;
  bVar2 = false;
  iVar6 = cnt;
  if (cnt < 1) {
    bVar5 = false;
  }
  else {
    do {
      uVar4 = data * 2 & 0x1fffffffe;
      uVar3 = (uint)data;
      uVar1 = uVar1 | (uint)(data * 2) ^ uVar3;
      iVar6 = iVar6 + -1;
      data = uVar4;
    } while (iVar6 != 0);
    bVar2 = (bool)((byte)(uVar3 >> 0xf) & 1);
    bVar5 = (bool)((byte)(uVar1 >> 0xf) & 1);
  }
  if (cnt != 0) {
    (this->reg).sr.x = bVar2;
  }
  (this->reg).sr.c = bVar2;
  (this->reg).sr.v = bVar5;
  (this->reg).sr.n = (bool)((byte)(data >> 0xf) & 1);
  (this->reg).sr.z = (short)data == 0;
  return (uint)data & 0xffff;
}

Assistant:

u32
Moira::shift(int cnt, u64 data) {

    switch (I) {

        case Instr::ASL:
        case Instr::ASL_LOOP:
        {
            bool carry = false;
            u32 changed = 0;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                u64 shifted = (data & 0xFFFFFFFF) << 1;
                changed |= (u32)(data ^ shifted);
                data = shifted;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case Instr::ASR:
        case Instr::ASR_LOOP:
        {
            bool carry = false;
            u32 changed = 0;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                u64 shifted = SEXT<S>(data) >> 1;
                changed |= (u32)(data ^ shifted);
                data = shifted;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case Instr::LSL:
        case Instr::LSL_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                data = data << 1;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::LSR:
        case Instr::LSR_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                data = data >> 1;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROL:
        case Instr::ROL_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                data = data << 1 | (carry ? 1 : 0);
            }

            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROR:
        case Instr::ROR_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                data >>= 1;
                if (carry) data |= MSBIT<S>();
            }

            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROXL:
        case Instr::ROXL_LOOP:
        {
            bool carry = reg.sr.x;

            for (int i = 0; i < cnt; i++) {

                bool extend = carry;
                carry = NBIT<S>(data);
                data = data << 1 | (extend ? 1 : 0);
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROXR:
        case Instr::ROXR_LOOP:
        {
            bool carry = reg.sr.x;

            for (int i = 0; i < cnt; i++) {

                bool extend = carry;
                carry = data & 1;
                data >>= 1;
                if (extend) data |= MSBIT<S>();
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);

    return CLIP<S>(data);
}